

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::maybe_emit_array_assignment
          (CompilerMSL *this,uint32_t id_lhs,uint32_t id_rhs)

{
  bool bVar1;
  Types TVar2;
  StorageClass SVar3;
  StorageClass SVar4;
  uint uVar5;
  SPIRType *type_00;
  Variant *this_00;
  SPIRConstant *c;
  bool local_131;
  StorageClass rhs_storage;
  StorageClass lhs_storage;
  string local_f8;
  uint local_d4;
  undefined1 local_d0 [4];
  uint32_t i;
  string local_b0;
  uint32_t local_8c;
  ID local_88;
  uint32_t array_size;
  ID local_80;
  BuiltIn builtin;
  string local_70;
  string local_50;
  SPIRVariable *local_30;
  SPIRVariable *var;
  SPIRType *type;
  uint32_t id_rhs_local;
  uint32_t id_lhs_local;
  CompilerMSL *this_local;
  
  type._0_4_ = id_rhs;
  type._4_4_ = id_lhs;
  _id_rhs_local = this;
  var = (SPIRVariable *)Compiler::expression_type((Compiler *)this,id_lhs);
  type_00 = Compiler::get_pointee_type((Compiler *)this,(SPIRType *)var);
  bVar1 = Compiler::is_array((Compiler *)this,type_00);
  if (bVar1) {
    local_30 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,type._4_4_);
    if (((local_30 == (SPIRVariable *)0x0) || ((local_30->remapped_variable & 1U) == 0)) ||
       ((local_30->statically_assigned & 1U) == 0)) {
      this_00 = VectorView<spirv_cross::Variant>::operator[]
                          (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>,(ulong)(uint32_t)type);
      TVar2 = Variant::get_type(this_00);
      if (((TVar2 == TypeConstant) && (local_30 != (SPIRVariable *)0x0)) &&
         ((local_30->deferred_declaration & 1U) != 0)) {
        CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,type._4_4_,true);
        c = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,(uint32_t)type);
        CompilerGLSL::constant_expression_abi_cxx11_
                  (&local_70,&this->super_CompilerGLSL,c,false,false);
        CompilerGLSL::
        statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,&local_50,(char (*) [4])0x5abcd8,&local_70,
                   (char (*) [2])0x5abb6c);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_50);
        this_local._7_1_ = true;
      }
      else {
        bVar1 = is_tesc_shader(this);
        local_131 = false;
        if (bVar1) {
          TypedID<(spirv_cross::Types)0>::TypedID(&local_80,type._4_4_);
          local_131 = Compiler::has_decoration((Compiler *)this,local_80,BuiltIn);
        }
        if (local_131 != false) {
          TypedID<(spirv_cross::Types)0>::TypedID(&local_88,type._4_4_);
          array_size = Compiler::get_decoration((Compiler *)this,local_88,BuiltIn);
          if ((array_size == BuiltInTessLevelInner) || (array_size == BuiltInTessLevelOuter)) {
            local_8c = get_physical_tess_level_array_size(this,array_size);
            if (local_8c == 1) {
              CompilerGLSL::to_expression_abi_cxx11_
                        (&local_b0,&this->super_CompilerGLSL,type._4_4_,true);
              CompilerGLSL::to_expression_abi_cxx11_
                        ((string *)local_d0,&this->super_CompilerGLSL,(uint32_t)type,true);
              CompilerGLSL::
              statement<std::__cxx11::string,char_const(&)[9],std::__cxx11::string,char_const(&)[6]>
                        (&this->super_CompilerGLSL,&local_b0,(char (*) [9])0x5a7d9c,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0,(char (*) [6])0x596468);
              ::std::__cxx11::string::~string((string *)local_d0);
              ::std::__cxx11::string::~string((string *)&local_b0);
            }
            else {
              for (local_d4 = 0; local_d4 < local_8c; local_d4 = local_d4 + 1) {
                CompilerGLSL::to_expression_abi_cxx11_
                          (&local_f8,&this->super_CompilerGLSL,type._4_4_,true);
                CompilerGLSL::to_expression_abi_cxx11_
                          ((string *)&rhs_storage,&this->super_CompilerGLSL,(uint32_t)type,true);
                CompilerGLSL::
                statement<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[10],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[4]>
                          (&this->super_CompilerGLSL,&local_f8,(char (*) [2])0x5978ea,&local_d4,
                           (char (*) [10])"] = half(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rhs_storage,(char (*) [2])0x5978ea,&local_d4,(char (*) [4])0x59646a);
                ::std::__cxx11::string::~string((string *)&rhs_storage);
                ::std::__cxx11::string::~string((string *)&local_f8);
              }
            }
            return true;
          }
        }
        SVar3 = CompilerGLSL::get_expression_effective_storage_class
                          (&this->super_CompilerGLSL,type._4_4_);
        SVar4 = CompilerGLSL::get_expression_effective_storage_class
                          (&this->super_CompilerGLSL,(uint32_t)type);
        uVar5 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x38])
                          (this,0,(ulong)type._4_4_,(ulong)(uint32_t)type,(ulong)SVar3,(ulong)SVar4)
        ;
        if ((uVar5 & 1) == 0) {
          this_local._7_1_ = false;
        }
        else {
          Compiler::register_write((Compiler *)this,type._4_4_);
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::maybe_emit_array_assignment(uint32_t id_lhs, uint32_t id_rhs)
{
	// We only care about assignments of an entire array
	auto &type = expression_type(id_lhs);
	if (!is_array(get_pointee_type(type)))
		return false;

	auto *var = maybe_get<SPIRVariable>(id_lhs);

	// Is this a remapped, static constant? Don't do anything.
	if (var && var->remapped_variable && var->statically_assigned)
		return true;

	if (ir.ids[id_rhs].get_type() == TypeConstant && var && var->deferred_declaration)
	{
		// Special case, if we end up declaring a variable when assigning the constant array,
		// we can avoid the copy by directly assigning the constant expression.
		// This is likely necessary to be able to use a variable as a true look-up table, as it is unlikely
		// the compiler will be able to optimize the spvArrayCopy() into a constant LUT.
		// After a variable has been declared, we can no longer assign constant arrays in MSL unfortunately.
		statement(to_expression(id_lhs), " = ", constant_expression(get<SPIRConstant>(id_rhs)), ";");
		return true;
	}

	if (is_tesc_shader() && has_decoration(id_lhs, DecorationBuiltIn))
	{
		auto builtin = BuiltIn(get_decoration(id_lhs, DecorationBuiltIn));
		// Need to manually unroll the array store.
		if (builtin == BuiltInTessLevelInner || builtin == BuiltInTessLevelOuter)
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin);
			if (array_size == 1)
				statement(to_expression(id_lhs), " = half(", to_expression(id_rhs), "[0]);");
			else
			{
				for (uint32_t i = 0; i < array_size; i++)
					statement(to_expression(id_lhs), "[", i, "] = half(", to_expression(id_rhs), "[", i, "]);");
			}
			return true;
		}
	}

	auto lhs_storage = get_expression_effective_storage_class(id_lhs);
	auto rhs_storage = get_expression_effective_storage_class(id_rhs);
	if (!emit_array_copy(nullptr, id_lhs, id_rhs, lhs_storage, rhs_storage))
		return false;

	register_write(id_lhs);

	return true;
}